

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O3

precise_measurement *
units::root(precise_measurement *__return_storage_ptr__,precise_measurement *pm,int power)

{
  double dVar1;
  precise_unit pVar2;
  precise_unit local_28;
  
  dVar1 = numericalRoot<double>(pm->value_,power);
  local_28.multiplier_ = (pm->units_).multiplier_;
  local_28.base_units_ = (pm->units_).base_units_;
  local_28.commodity_ = (pm->units_).commodity_;
  pVar2 = root(&local_28,power);
  __return_storage_ptr__->value_ = dVar1;
  __return_storage_ptr__->units_ = pVar2;
  return __return_storage_ptr__;
}

Assistant:

precise_measurement root(const precise_measurement& pm, int power)
{
    return {numericalRoot(pm.value(), power), root(pm.units(), power)};
}